

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureLevelCase::test
          (AttachmentTextureLevelCase *this)

{
  CallLogWrapper *testCtx;
  uint in_EAX;
  GLuint pname;
  GLenum reference;
  int mipmapLevel;
  GLenum target;
  GLuint textureID;
  GLuint framebufferID;
  
  _textureID = (ulong)in_EAX;
  testCtx = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(testCtx,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(testCtx,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (target = 0; target != 7; target = target + 1) {
    _textureID = _textureID & 0xffffffff00000000;
    glu::CallLogWrapper::glGenTextures(testCtx,1,&textureID);
    glu::CallLogWrapper::glBindTexture(testCtx,0xde1,textureID);
    glu::CallLogWrapper::glTexStorage2D(testCtx,0xde1,7,0x8051,0x80,0x80);
    ApiCase::expectError(&this->super_ApiCase,0);
    pname = textureID;
    reference = target;
    glu::CallLogWrapper::glFramebufferTexture2D(testCtx,0x8d40,0x8ce0,0xde1,textureID,target);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkColorAttachmentParam
              ((anon_unknown_1 *)
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (TestContext *)testCtx,(CallLogWrapper *)0x8cd2,target,pname,reference);
    glu::CallLogWrapper::glFramebufferTexture2D(testCtx,0x8d40,0x8ce0,0xde1,0,0);
    glu::CallLogWrapper::glDeleteTextures(testCtx,1,&textureID);
  }
  glu::CallLogWrapper::glDeleteFramebuffers(testCtx,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		for (int mipmapLevel = 0; mipmapLevel < 7; ++mipmapLevel)
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D, textureID);
			glTexStorage2D(GL_TEXTURE_2D, 7, GL_RGB8, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, mipmapLevel);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, mipmapLevel);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}